

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O3

int __thiscall H264StreamReader::processPPS(H264StreamReader *this,uint8_t *buff)

{
  mapped_type pPVar1;
  int iVar2;
  PPSUnit *this_00;
  uint8_t *puVar3;
  mapped_type *ppPVar4;
  
  this_00 = (PPSUnit *)operator_new(0x58);
  (this_00->super_NALUnit).bitReader.super_BitStream.m_totalBits = 0;
  (this_00->super_NALUnit).bitReader.super_BitStream.m_buffer = (uint *)0x0;
  (this_00->super_NALUnit).bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  (this_00->super_NALUnit).bitReader.m_curVal = 0;
  (this_00->super_NALUnit).bitReader.m_bitLeft = 0;
  (this_00->super_NALUnit).nal_unit_type = nuUnspecified;
  (this_00->super_NALUnit).nal_ref_idc = 0;
  (this_00->super_NALUnit).m_nalBuffer = (uint8_t *)0x0;
  (this_00->super_NALUnit).m_nalBufferLen = 0;
  (this_00->super_NALUnit)._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0023d550;
  this_00->pic_parameter_set_id = 0;
  this_00->seq_parameter_set_id = 0;
  this_00->entropy_coding_mode_flag = 1;
  this_00->pic_order_present_flag = 1;
  this_00->m_ready = false;
  puVar3 = NALUnit::findNALWithStartCode
                     (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,true);
  NALUnit::decodeBuffer((NALUnit *)this_00,buff,puVar3);
  iVar2 = PPSUnit::deserialize(this_00);
  if (iVar2 == 0) {
    ppPVar4 = std::
              map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
              ::operator[](&this->m_ppsMap,&this_00->pic_parameter_set_id);
    pPVar1 = *ppPVar4;
    if (pPVar1 != (mapped_type)0x0) {
      (pPVar1->super_NALUnit)._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0023f088;
      puVar3 = (pPVar1->super_NALUnit).m_nalBuffer;
      if (puVar3 != (uint8_t *)0x0) {
        operator_delete__(puVar3);
      }
    }
    operator_delete(pPVar1,0x58);
    ppPVar4 = std::
              map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
              ::operator[](&this->m_ppsMap,&this_00->pic_parameter_set_id);
    *ppPVar4 = this_00;
  }
  else {
    (this_00->super_NALUnit)._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0023f088;
    puVar3 = (this_00->super_NALUnit).m_nalBuffer;
    if (puVar3 != (uint8_t *)0x0) {
      operator_delete__(puVar3);
    }
    operator_delete(this_00,0x58);
  }
  return iVar2;
}

Assistant:

int H264StreamReader::processPPS(uint8_t *buff)
{
    auto *pps = new PPSUnit();
    const uint8_t *nextNal = NALUnit::findNALWithStartCode(buff, m_bufEnd, true);

    pps->decodeBuffer(buff, nextNal);
    const int nalRez = pps->deserialize();
    if (nalRez != 0)
    {
        delete pps;
        return nalRez;  // not enough buffer
    }
    delete m_ppsMap[pps->pic_parameter_set_id];
    m_ppsMap[pps->pic_parameter_set_id] = pps;
    return 0;
}